

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O3

bool __thiscall duckdb::Linenoise::EditMoveRowDown(Linenoise *this)

{
  bool bVar1;
  size_t sVar2;
  int cursor_col;
  int cols;
  int rows;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  bVar1 = Terminal::IsMultiline();
  if (bVar1) {
    PositionToColAndRow(this,this->pos,&local_54,&local_58,&local_4c,&local_50);
    bVar1 = local_54 < local_4c;
    if (local_54 < local_4c) {
      local_48[0] = local_38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"source pos %d","");
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
      local_48[0] = local_38;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"move from row %d to row %d","");
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
      sVar2 = ColAndRowToPosition(this,local_54 + 1,local_58);
      this->pos = sVar2;
      local_48[0] = local_38;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"new pos %d","");
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
      RefreshLine(this);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Linenoise::EditMoveRowDown() {
	if (!Terminal::IsMultiline()) {
		return false;
	}
	int rows, cols;
	int cursor_row, cursor_col;
	PositionToColAndRow(pos, cursor_row, cursor_col, rows, cols);
	if (cursor_row >= rows) {
		return false;
	}
	// we can move the cursor a line down
	Linenoise::Log("source pos %d", pos);
	Linenoise::Log("move from row %d to row %d", cursor_row, cursor_row + 1);
	cursor_row++;
	pos = ColAndRowToPosition(cursor_row, cursor_col);
	Linenoise::Log("new pos %d", pos);
	RefreshLine();
	return true;
}